

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O2

bool __thiscall
Corrade::Utility::ConfigurationGroup::removeGroup
          (ConfigurationGroup *this,ConfigurationGroup *group)

{
  byte *pbVar1;
  Group *pGVar2;
  ConfigurationGroup *this_00;
  const_iterator __position;
  
  __position._M_current =
       (this->_groups).
       super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->_groups).
           super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__position._M_current == pGVar2) {
LAB_00115853:
      return __position._M_current != pGVar2;
    }
    this_00 = (__position._M_current)->group;
    if (this_00 == group) {
      if (group != (ConfigurationGroup *)0x0) {
        ~ConfigurationGroup(this_00);
      }
      operator_delete(this_00);
      std::
      vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
      ::erase(&this->_groups,__position);
      if (this->_configuration != (Configuration *)0x0) {
        pbVar1 = (byte *)((long)&(this->_configuration->_flags)._value + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      goto LAB_00115853;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

bool ConfigurationGroup::removeGroup(ConfigurationGroup* const group) {
    for(auto it = _groups.begin(); it != _groups.end(); ++it) {
        if(it->group == group) {
            delete it->group;
            _groups.erase(it);
            if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
            return true;
        }
    }

    return false;
}